

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::UpdateProgress(cmCursesMainForm *this,string *msg,float prog)

{
  string *psVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (prog < 0.0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Outputs,
               msg);
    DisplayOutputs(this,msg);
    return;
  }
  psVar1 = &this->LastProgress;
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::to_string(&local_50,(int)(prog * 100.0));
  std::operator+(&local_70,&local_50,"% [");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  cVar2 = (char)(int)(prog * 40.0);
  std::__cxx11::string::append((ulong)psVar1,cVar2);
  std::__cxx11::string::append((ulong)psVar1,'(' - cVar2);
  std::operator+(&local_50,"] ",msg);
  std::operator+(&local_70,&local_50,"...");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  DisplayOutputs(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmCursesMainForm::UpdateProgress(const std::string& msg, float prog)
{
  if (prog >= 0) {
    constexpr int progressBarWidth = 40;
    int progressBarCompleted = static_cast<int>(progressBarWidth * prog);
    int percentCompleted = static_cast<int>(100 * prog);
    this->LastProgress = (percentCompleted < 100 ? " " : "");
    this->LastProgress += (percentCompleted < 10 ? " " : "");
    this->LastProgress += std::to_string(percentCompleted) + "% [";
    this->LastProgress.append(progressBarCompleted, '#');
    this->LastProgress.append(progressBarWidth - progressBarCompleted, ' ');
    this->LastProgress += "] " + msg + "...";
    this->DisplayOutputs(std::string());
  } else {
    this->Outputs.emplace_back(msg);
    this->DisplayOutputs(msg);
  }
}